

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  byte *pbVar1;
  t_domain tVar2;
  ulong uVar3;
  cmake *this_00;
  __type _Var4;
  bool bVar5;
  int iVar6;
  byte *pbVar7;
  size_t sVar8;
  _Elt_pointer ptVar9;
  char *pcVar10;
  undefined8 uVar11;
  size_type sVar12;
  ostream *poVar13;
  undefined7 in_register_00000009;
  byte *pbVar14;
  byte *pbVar15;
  byte bVar16;
  allocator local_351;
  cmMakefile *local_350;
  string *local_348;
  uint local_340;
  MessageType local_33c;
  allocator local_336;
  allocator local_335;
  undefined4 local_334;
  long local_330;
  string local_328;
  string varresult_1;
  string result;
  string varresult;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  long local_280;
  string *local_278;
  RegularExpression *local_270;
  Snapshot *local_268;
  cmState *local_260;
  stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> openstack;
  cmOutputConverter converter;
  string local_1e8;
  string local_1c8;
  string variable;
  
  local_334 = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  pbVar14 = (byte *)(source->_M_dataplus)._M_p;
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  local_350 = this;
  local_348 = errorstr;
  local_278 = source;
  std::__cxx11::string::reserve((ulong)&result);
  std::stack<t_lookup,std::deque<t_lookup,std::allocator<t_lookup>>>::
  stack<std::deque<t_lookup,std::allocator<t_lookup>>,void>(&openstack);
  variable._M_dataplus._M_p = (pointer)((ulong)variable._M_dataplus._M_p._4_4_ << 0x20);
  variable._M_string_length = 0;
  std::deque<t_lookup,_std::allocator<t_lookup>_>::emplace_back<t_lookup>
            (&openstack.c,(t_lookup *)&variable);
  local_330 = line;
  local_260 = local_350->LocalGenerator->GlobalGenerator->CMakeInstance->State;
  bVar16 = *pbVar14;
  local_270 = &local_350->cmNamedCurly;
  local_268 = &local_350->StateSnapshot;
  local_33c = LOG;
  local_340 = 0;
  pbVar15 = pbVar14;
  do {
    if (bVar16 == 10) {
      local_330 = local_330 + 1;
    }
    else if (bVar16 == 0x24) {
      if (atOnly) {
LAB_003552e6:
        if (!noEscapes) {
          bVar16 = pbVar15[1];
          if (bVar16 == 0x3b) {
            sVar12 = std::deque<t_lookup,_std::allocator<t_lookup>_>::size(&openstack.c);
            if (sVar12 != 1) {
LAB_003553ee:
              iVar6 = isalnum((int)(char)bVar16);
              if ((bVar16 == 0) || (iVar6 != 0)) {
                uVar11 = std::__cxx11::string::append((char *)local_348);
                if (bVar16 != 0) {
                  uVar11 = std::__cxx11::string::push_back((char)local_348);
                }
                local_340 = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
                std::__cxx11::string::append((char *)local_348);
              }
              else {
                std::__cxx11::string::append((char *)&result,(ulong)pbVar14);
                pbVar14 = pbVar15 + 1;
              }
            }
          }
          else {
            if (bVar16 == 0x6e) {
              std::__cxx11::string::append((char *)&result,(ulong)pbVar14);
              std::__cxx11::string::append((char *)&result);
            }
            else if (bVar16 == 0x72) {
              std::__cxx11::string::append((char *)&result,(ulong)pbVar14);
              std::__cxx11::string::append((char *)&result);
            }
            else {
              if (bVar16 != 0x74) goto LAB_003553ee;
              std::__cxx11::string::append((char *)&result,(ulong)pbVar14);
              std::__cxx11::string::append((char *)&result);
            }
            pbVar14 = pbVar15 + 2;
          }
          if (*pbVar14 != 0) {
            pbVar15 = pbVar15 + 1;
          }
        }
      }
      else {
        varresult_1._M_dataplus._M_p = varresult_1._M_dataplus._M_p & 0xffffffff00000000;
        varresult_1._M_string_length = 0;
        pbVar1 = pbVar15 + 1;
        bVar16 = pbVar15[1];
        if (bVar16 == 0) {
          std::__cxx11::string::append((char *)&result,(ulong)pbVar14);
          pbVar14 = pbVar1;
        }
        else if (bVar16 != 0x3c) {
          if (bVar16 == 0x7b) {
            pbVar15 = pbVar15 + 2;
          }
          else {
            bVar5 = cmHasLiteralPrefix<char_const*,5ul>((char *)pbVar1,(char (*) [5])"ENV{");
            if (bVar5) {
              pbVar15 = pbVar15 + 5;
              varresult_1._M_dataplus._M_p._0_4_ = 1;
            }
            else {
              bVar5 = cmHasLiteralPrefix<char_const*,7ul>((char *)pbVar1,(char (*) [7])"CACHE{");
              if (!bVar5) {
                bVar5 = cmsys::RegularExpression::find(local_270,(char *)pbVar1);
                if (bVar5) {
                  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_328,pbVar1,
                             pbVar1 + ((long)(local_350->cmNamedCurly).endp[0] -
                                      (long)(local_350->cmNamedCurly).searchstring));
                  std::operator+(&varresult,"Syntax $",&local_328);
                  std::operator+(&variable,&varresult,
                                 "{} is not supported.  Only ${}, $ENV{}, and $CACHE{} are allowed."
                                );
                  std::__cxx11::string::operator=((string *)local_348,(string *)&variable);
                  std::__cxx11::string::~string((string *)&variable);
                  std::__cxx11::string::~string((string *)&varresult);
                  uVar11 = std::__cxx11::string::~string((string *)&local_328);
                  local_340 = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
                  local_33c = FATAL_ERROR;
                }
                goto LAB_00355aa8;
              }
              pbVar15 = pbVar15 + 7;
              varresult_1._M_dataplus._M_p._0_4_ = 2;
            }
          }
          std::__cxx11::string::append((char *)&result,(ulong)pbVar14);
          varresult_1._M_string_length = result._M_string_length;
          std::deque<t_lookup,_std::allocator<t_lookup>_>::push_back
                    (&openstack.c,(value_type *)&varresult_1);
          pbVar14 = pbVar15;
          pbVar15 = pbVar15 + -1;
        }
      }
    }
    else if (bVar16 == 0x40) {
      if (replaceAt) {
        pbVar1 = pbVar15 + 1;
        pbVar7 = (byte *)strchr((char *)pbVar1,0x40);
        if ((pbVar7 != pbVar1 && pbVar7 != (byte *)0x0) &&
           (sVar8 = strspn((char *)pbVar1,
                           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-"),
           pbVar7 == pbVar1 + sVar8)) {
          variable._M_dataplus._M_p = (pointer)&variable.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&variable,pbVar1,pbVar1 + ~(ulong)pbVar15 + (long)pbVar7);
          pcVar10 = GetSafeDefinition(local_350,&variable);
          std::__cxx11::string::string((string *)&varresult,pcVar10,(allocator *)&local_328);
          if ((char)local_334 != '\0') {
            cmSystemTools::EscapeQuotes(&local_328,&varresult);
            std::__cxx11::string::operator=((string *)&varresult,(string *)&local_328);
            std::__cxx11::string::~string((string *)&local_328);
          }
          std::__cxx11::string::append((char *)&result,(ulong)pbVar14);
          std::__cxx11::string::append((string *)&result);
          std::__cxx11::string::~string((string *)&varresult);
          std::__cxx11::string::~string((string *)&variable);
          pbVar14 = pbVar7 + 1;
          pbVar15 = pbVar7;
          goto LAB_00355aa8;
        }
      }
LAB_003551a5:
      sVar12 = std::deque<t_lookup,_std::allocator<t_lookup>_>::size(&openstack.c);
      if (((1 < sVar12) && (iVar6 = isalnum((int)(char)bVar16), iVar6 == 0)) &&
         ((0x34 < bVar16 - 0x2b || ((0x1000000000001dU >> ((ulong)(bVar16 - 0x2b) & 0x3f) & 1) == 0)
          ))) {
        std::__cxx11::string::append((char *)local_348);
        std::__cxx11::string::push_back((char)local_348);
        std::__cxx11::string::append((char *)&result,(ulong)pbVar14);
        std::__cxx11::string::substr((ulong)&local_328,(ulong)&result);
        std::operator+(&varresult,"\') in a variable name: \'",&local_328);
        std::operator+(&variable,&varresult,"\'");
        std::__cxx11::string::append((string *)local_348);
        std::__cxx11::string::~string((string *)&variable);
        std::__cxx11::string::~string((string *)&varresult);
        std::__cxx11::string::~string((string *)&local_328);
        goto LAB_00355b7c;
      }
    }
    else {
      if (bVar16 == 0x5c) goto LAB_003552e6;
      if (bVar16 != 0x7d) {
        if (bVar16 != 0) goto LAB_003551a5;
        if ((local_340 & 1) != 0) goto LAB_00355b7c;
        break;
      }
      sVar12 = std::deque<t_lookup,_std::allocator<t_lookup>_>::size(&openstack.c);
      if (sVar12 < 2) goto LAB_00355aa8;
      ptVar9 = openstack.c.super__Deque_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (openstack.c.super__Deque_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          openstack.c.super__Deque_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ptVar9 = openstack.c.super__Deque_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      tVar2 = ptVar9[-1].domain;
      uVar3 = ptVar9[-1].loc;
      std::deque<t_lookup,_std::allocator<t_lookup>_>::pop_back(&openstack.c);
      std::__cxx11::string::append((char *)&result,(ulong)pbVar14);
      std::__cxx11::string::substr((ulong)&local_328,(ulong)&result);
      varresult_1._M_dataplus._M_p = (pointer)&varresult_1.field_2;
      varresult_1._M_string_length = 0;
      varresult_1.field_2._M_local_buf[0] = '\0';
      if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
           ::lineVar_abi_cxx11_ == '\0') &&
         (iVar6 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                       ::lineVar_abi_cxx11_), iVar6 != 0)) {
        std::__cxx11::string::string
                  ((string *)
                   &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                    ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE",(allocator *)&variable);
        __cxa_atexit(std::__cxx11::string::~string,
                     &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                      ::lineVar_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                             ::lineVar_abi_cxx11_);
      }
      if (tVar2 == NORMAL) {
        if ((filename == (char *)0x0) ||
           (_Var4 = std::operator==(&local_328,
                                    &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                     ::lineVar_abi_cxx11_), !_Var4)) {
          pcVar10 = GetDefinition(local_350,&local_328);
          goto LAB_00355628;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&variable);
        std::ostream::_M_insert<long>((long)&variable);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&varresult_1,(string *)&varresult);
        std::__cxx11::string::~string((string *)&varresult);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variable);
LAB_00355688:
        if (((!removeEmpty) &&
            (local_350->LocalGenerator->GlobalGenerator->CMakeInstance->WarnUninitialized == true))
           && (bVar5 = VariableInitialized(local_350,&local_328), !bVar5)) {
          if (local_350->CheckSystemVars == false) {
            std::__cxx11::string::string((string *)&variable,filename,(allocator *)&local_1c8);
            pcVar10 = GetHomeDirectory(local_350);
            std::__cxx11::string::string((string *)&varresult,pcVar10,&local_351);
            bVar5 = cmsys::SystemTools::IsSubDirectory(&variable,&varresult);
            if (bVar5) {
              std::__cxx11::string::~string((string *)&varresult);
              std::__cxx11::string::~string((string *)&variable);
            }
            else {
              std::__cxx11::string::string((string *)&converter,filename,&local_335);
              pcVar10 = GetHomeOutputDirectory(local_350);
              std::__cxx11::string::string((string *)&local_1e8,pcVar10,&local_336);
              bVar5 = cmsys::SystemTools::IsSubDirectory((string *)&converter,&local_1e8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&converter);
              std::__cxx11::string::~string((string *)&varresult);
              std::__cxx11::string::~string((string *)&variable);
              if (!bVar5) goto LAB_00355a75;
            }
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&variable);
          varresult._M_dataplus._M_p = (pointer)&varresult.field_2;
          varresult._M_string_length = 0;
          varresult.field_2._M_local_buf[0] = '\0';
          local_2a0._M_p = (pointer)&local_290;
          local_298 = 0;
          local_290._M_local_buf[0] = '\0';
          local_280 = 0;
          cmOutputConverter::cmOutputConverter(&converter,*local_268);
          std::__cxx11::string::string((string *)&local_1c8,filename,&local_351);
          cmOutputConverter::Convert(&local_1e8,&converter,&local_1c8,HOME,UNCHANGED);
          std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1c8);
          local_280 = local_330;
          poVar13 = std::operator<<((ostream *)&variable,"uninitialized variable \'");
          poVar13 = std::operator<<(poVar13,(string *)&local_328);
          std::operator<<(poVar13,"\'");
          this_00 = local_350->LocalGenerator->GlobalGenerator->CMakeInstance;
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_1e8,(cmListFileContext *)&varresult);
          std::__cxx11::string::~string((string *)&local_1e8);
          cmListFileContext::~cmListFileContext((cmListFileContext *)&varresult);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variable);
        }
      }
      else {
        if (tVar2 == ENVIRONMENT) {
          pcVar10 = cmsys::SystemTools::GetEnv(local_328._M_dataplus._M_p);
        }
        else {
          if (tVar2 != CACHE) goto LAB_00355688;
          pcVar10 = cmState::GetCacheEntryValue(local_260,&local_328);
        }
LAB_00355628:
        if (pcVar10 == (char *)0x0) goto LAB_00355688;
        if ((char)local_334 == '\0') {
          std::__cxx11::string::assign((char *)&varresult_1);
        }
        else {
          std::__cxx11::string::string((string *)&varresult,pcVar10,(allocator *)&converter);
          cmSystemTools::EscapeQuotes(&variable,&varresult);
          std::__cxx11::string::operator=((string *)&varresult_1,(string *)&variable);
          std::__cxx11::string::~string((string *)&variable);
          std::__cxx11::string::~string((string *)&varresult);
        }
      }
LAB_00355a75:
      std::__cxx11::string::replace
                ((ulong)&result,uVar3,(string *)(result._M_string_length - uVar3));
      std::__cxx11::string::~string((string *)&varresult_1);
      std::__cxx11::string::~string((string *)&local_328);
      pbVar14 = pbVar15 + 1;
    }
LAB_00355aa8:
    if ((local_340 & 1) != 0) goto LAB_00355b7c;
    bVar16 = pbVar15[1];
    pbVar15 = pbVar15 + 1;
  } while (bVar16 != 0);
  sVar12 = std::deque<t_lookup,_std::allocator<t_lookup>_>::size(&openstack.c);
  if (sVar12 == 1) {
    std::__cxx11::string::append((char *)&result);
    std::__cxx11::string::_M_assign((string *)local_278);
  }
  else {
    std::__cxx11::string::append((char *)local_348);
LAB_00355b7c:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&variable);
    std::operator<<((ostream *)&variable,"Syntax error in cmake code ");
    if (filename != (char *)0x0) {
      poVar13 = std::operator<<((ostream *)&variable,"at\n");
      poVar13 = std::operator<<(poVar13,"  ");
      poVar13 = std::operator<<(poVar13,filename);
      poVar13 = std::operator<<(poVar13,":");
      poVar13 = std::ostream::_M_insert<long>((long)poVar13);
      std::operator<<(poVar13,"\n");
    }
    poVar13 = std::operator<<((ostream *)&variable,"when parsing string\n");
    poVar13 = std::operator<<(poVar13,"  ");
    poVar13 = std::operator<<(poVar13,(string *)local_278);
    std::operator<<(poVar13,"\n");
    std::operator<<((ostream *)&variable,(string *)local_348);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_348,(string *)&varresult);
    std::__cxx11::string::~string((string *)&varresult);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variable);
    local_33c = FATAL_ERROR;
  }
  std::_Deque_base<t_lookup,_std::allocator<t_lookup>_>::~_Deque_base
            ((_Deque_base<t_lookup,_std::allocator<t_lookup>_> *)&openstack);
  std::__cxx11::string::~string((string *)&result);
  return local_33c;
}

Assistant:

cmake::MessageType cmMakefile::ExpandVariablesInStringNew(
                                            std::string& errorstr,
                                            std::string& source,
                                            bool escapeQuotes,
                                            bool noEscapes,
                                            bool atOnly,
                                            const char* filename,
                                            long line,
                                            bool removeEmpty,
                                            bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::stack<t_lookup> openstack;
  bool error = false;
  bool done = false;
  openstack.push(t_lookup());
  cmake::MessageType mtype = cmake::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  do
    {
    char inc = *in;
    switch(inc)
      {
      case '}':
        if(openstack.size() > 1)
          {
          t_lookup var = openstack.top();
          openstack.pop();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = NULL;
          std::string varresult;
          static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
          switch(var.domain)
            {
            case NORMAL:
              if(filename && lookup == lineVar)
                {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
                }
              else
                {
                value = this->GetDefinition(lookup);
                }
              break;
            case ENVIRONMENT:
              value = cmSystemTools::GetEnv(lookup.c_str());
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
            }
          // Get the string we're meant to append to.
          if(value)
            {
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(value);
              }
            else
              {
              varresult = value;
              }
            }
          else if(!removeEmpty)
            {
            // check to see if we need to print a warning
            // if strict mode is on and the variable has
            // not been "cleared"/initialized with a set(foo ) call
            if(this->GetCMakeInstance()->GetWarnUninitialized() &&
               !this->VariableInitialized(lookup))
              {
              if (this->CheckSystemVars ||
                  cmSystemTools::IsSubDirectory(filename,
                                                this->GetHomeDirectory()) ||
                  cmSystemTools::IsSubDirectory(filename,
                                             this->GetHomeOutputDirectory()))
                {
                std::ostringstream msg;
                cmListFileContext lfc;
                cmOutputConverter converter(this->StateSnapshot);
                lfc.FilePath =
                    converter.Convert(filename, cmOutputConverter::HOME);
                lfc.Line = line;
                msg << "uninitialized variable \'" << lookup << "\'";
                this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                                       msg.str(), lfc);
                }
              }
            }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
          }
        break;
      case '$':
        if(!atOnly)
          {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = NULL;
          char nextc = *next;
          if(nextc == '{')
            {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
            }
          else if(nextc == '<')
            {
            }
          else if(!nextc)
            {
            result.append(last, next - last);
            last = next;
            }
          else if(cmHasLiteralPrefix(next, "ENV{"))
            {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
            }
          else if(cmHasLiteralPrefix(next, "CACHE{"))
            {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
            }
          else
            {
            if(this->cmNamedCurly.find(next))
              {
              errorstr = "Syntax $"
                  + std::string(next, this->cmNamedCurly.end())
                  + "{} is not supported.  Only ${}, $ENV{}, "
                    "and $CACHE{} are allowed.";
              mtype = cmake::FATAL_ERROR;
              error = true;
              }
            }
          if(start)
            {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push(lookup);
            }
          break;
          }
      case '\\':
        if(!noEscapes)
          {
          const char* next = in + 1;
          char nextc = *next;
          if(nextc == 't')
            {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
            }
          else if(nextc == 'n')
            {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
            }
          else if(nextc == 'r')
            {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
            }
          else if(nextc == ';' && openstack.size() == 1)
            {
            // Handled in ExpandListArgument; pass the backslash literally.
            }
          else if (isalnum(nextc) || nextc == '\0')
            {
            errorstr += "Invalid character escape '\\";
            if (nextc)
              {
              errorstr += nextc;
              errorstr += "'.";
              }
            else
              {
              errorstr += "' (at end of input).";
              }
            error = true;
            }
          else
            {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
            }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if(*last)
            {
            ++in;
            }
          }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if(replaceAt)
          {
          const char* nextAt = strchr(in + 1, '@');
          if(nextAt && nextAt != in + 1 &&
             nextAt == in + 1 + strspn(in + 1,
                "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                "abcdefghijklmnopqrstuvwxyz"
                "0123456789/_.+-"))
            {
            std::string variable(in + 1, nextAt - in - 1);
            std::string varresult = this->GetSafeDefinition(variable);
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(varresult);
              }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
            }
          }
        // Failed to find a valid @ expansion; treat it as literal.
        /* FALLTHROUGH */
      default:
        {
        if(openstack.size() > 1 &&
           !(isalnum(inc) || inc == '_' ||
             inc == '/' || inc == '.' ||
             inc == '+' || inc == '-'))
          {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" + result.substr(openstack.top().loc) + "'";
          mtype = cmake::FATAL_ERROR;
          error = true;
          }
        break;
        }
      }
    // Look at the next character.
    } while(!error && !done && *++in);

  // Check for open variable references yet.
  if(!error && openstack.size() != 1)
    {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
    }

  if(error)
    {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if(filename)
      {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
            << "  " << filename << ":" << line << "\n";
      }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = cmake::FATAL_ERROR;
    errorstr = emsg.str();
    }
  else
    {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
    }

  return mtype;
}